

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::tryRead
          (AsyncIoStreamWithInitialBuffer *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  size_t start;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> WVar1;
  bool bVar2;
  size_t sVar3;
  uchar *puVar4;
  AsyncIoStream *pAVar5;
  undefined8 in_R8;
  ArrayPtr<unsigned_char> AVar6;
  Type local_160;
  Fault local_158;
  Fault f_3;
  undefined1 local_148 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_3;
  Fault f_2;
  unsigned_long *local_110;
  undefined1 local_108 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition_2;
  Fault f_1;
  undefined1 local_d0 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_1;
  size_t bytesToCopy_1;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> bytesToCopy;
  byte *destination;
  Fault local_68;
  Fault f;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncIoStreamWithInitialBuffer *this_local;
  
  _kjCondition._32_8_ = in_R8;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (unsigned_long *)&_kjCondition.result);
  kj::_::DebugExpression<unsigned_long&>::operator>=
            ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_58,
             (DebugExpression<unsigned_long&> *)&f,&maxBytes_local);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x11cf,FAILED,"maxBytes >= minBytes","_kjCondition,",
               (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_58);
    kj::_::Debug::Fault::fatal(&local_68);
  }
  bytesToCopy = minBytes_local;
  sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
  if (sVar3 < maxBytes_local) {
    _kjCondition_1._32_8_ =
         ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
    f_1.exception =
         (Exception *)
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                    (unsigned_long *)&_kjCondition_1.result);
    kj::_::DebugExpression<unsigned_long&>::operator<
              ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_d0,
               (DebugExpression<unsigned_long&> *)&f_1,&maxBytes_local);
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
    WVar1 = bytesToCopy;
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x11e4,FAILED,"bytesToCopy < minBytes","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_d0);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
    }
    if (_kjCondition_1._32_8_ != 0) {
      puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
      memcpy((void *)WVar1,puVar4,_kjCondition_1._32_8_);
      ArrayPtr<unsigned_char>::operator=
                ((ArrayPtr<unsigned_char> *)((long)buffer + 0x38),(void *)0x0);
      Array<unsigned_char>::operator=((Array<unsigned_char> *)((long)buffer + 0x20),(void *)0x0);
      maxBytes_local = maxBytes_local - _kjCondition_1._32_8_;
      _kjCondition._32_8_ = _kjCondition._32_8_ - _kjCondition_1._32_8_;
      local_110 = (unsigned_long *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&maxBytes_local);
      f_2.exception._4_4_ = 1;
      kj::_::DebugExpression<unsigned_long&>::operator>=
                ((DebugComparison<unsigned_long_&,_int> *)local_108,
                 (DebugExpression<unsigned_long&> *)&local_110,(int *)((long)&f_2.exception + 4));
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
      if (!bVar2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
                  ((Fault *)&_kjCondition_3.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x11ec,FAILED,"minBytes >= 1","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_int> *)local_108);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_3.result);
      }
      f_3.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (unsigned_long *)&_kjCondition.result);
      kj::_::DebugExpression<unsigned_long&>::operator>=
                ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_148,
                 (DebugExpression<unsigned_long&> *)&f_3,&maxBytes_local);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  (&local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x11ed,FAILED,"maxBytes >= minBytes","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_148);
        kj::_::Debug::Fault::fatal(&local_158);
      }
    }
    pAVar5 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)buffer + 0x10));
    (*(pAVar5->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (&local_160,pAVar5,bytesToCopy + _kjCondition_1._32_8_,maxBytes_local,
               _kjCondition._32_8_);
    Promise<unsigned_long>::
    then<kj::AsyncIoStreamWithInitialBuffer::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>
              ((Promise<unsigned_long> *)this,&local_160);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_160);
  }
  else {
    local_90 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
    local_88 = min<unsigned_long&,unsigned_long>((unsigned_long *)&_kjCondition.result,&local_90);
    WVar1 = bytesToCopy;
    puVar4 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
    memcpy((void *)WVar1,puVar4,local_88);
    start = local_88;
    sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
    AVar6 = ArrayPtr<unsigned_char>::slice
                      ((ArrayPtr<unsigned_char> *)((long)buffer + 0x38),start,sVar3);
    bytesToCopy_1 = (size_t)AVar6.ptr;
    *(size_t *)((long)buffer + 0x38) = bytesToCopy_1;
    local_98 = AVar6.size_;
    *(size_t *)((long)buffer + 0x40) = local_98;
    sVar3 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)((long)buffer + 0x38));
    if (sVar3 == 0) {
      Array<unsigned_char>::operator=((Array<unsigned_char> *)((long)buffer + 0x20),(void *)0x0);
    }
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,local_88);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(maxBytes >= minBytes);
    auto destination = static_cast<byte*>(buffer);

    // If there are at least minBytes available in the leftover buffer...
    if (leftover.size() >= minBytes) {
      // We are going to immediately read up to maxBytes from the leftover buffer...
      auto bytesToCopy = kj::min(maxBytes, leftover.size());
      memcpy(destination, leftover.begin(), bytesToCopy);
      leftover = leftover.slice(bytesToCopy, leftover.size());

      // If we've consumed all of the data in the leftover buffer, go ahead and free it.
      if (leftover.size() == 0) {
        leftoverBackingBuffer = nullptr;
      }

      return bytesToCopy;
    } else {
      // We know here that leftover.size() is less than minBytes, but it might not
      // be zero. Copy everything from leftover into the destination buffer then read
      // the rest from the underlying stream.
      auto bytesToCopy = leftover.size();
      KJ_DASSERT(bytesToCopy < minBytes);

      if (bytesToCopy > 0) {
        memcpy(destination, leftover.begin(), bytesToCopy);
        leftover = nullptr;
        leftoverBackingBuffer = nullptr;
        minBytes -= bytesToCopy;
        maxBytes -= bytesToCopy;
        KJ_DASSERT(minBytes >= 1);
        KJ_DASSERT(maxBytes >= minBytes);
      }

      return stream->tryRead(destination + bytesToCopy, minBytes, maxBytes)
          .then([bytesToCopy](size_t amount) { return amount + bytesToCopy; });
    }
  }